

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5DlidxIterPrevR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  long *plVar1;
  u8 *puVar2;
  bool bVar3;
  Fts5DlidxLvl *pFVar4;
  int iVar5;
  uint uVar6;
  Fts5Data *pFVar7;
  Fts5Data *pFVar8;
  int iVar9;
  int iVar10;
  Fts5DlidxLvl *pLvl;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  u64 local_38;
  
  pFVar7 = (Fts5Data *)((long)iLvl * 0x20);
  pFVar4 = pIter->aLvl;
  pLvl = (Fts5DlidxLvl *)((long)&pFVar7->p + (long)pFVar4);
  iVar15 = *(int *)((long)&pFVar7->nn + (long)pFVar4);
  uVar6 = *(uint *)((long)&pFVar7[1].p + (long)pFVar4);
  if ((int)uVar6 < iVar15) {
    iVar10 = 0;
    if (9 < iVar15) {
      iVar10 = iVar15 + -9;
    }
    puVar2 = pLvl->pData->p;
    iVar5 = iVar15 + -1;
    if (iVar10 <= iVar15 + -1) {
      iVar5 = iVar10;
    }
    lVar12 = (long)iVar15;
    do {
      iVar9 = iVar15;
      iVar15 = iVar5;
      iVar14 = iVar5 + 1;
      if (lVar12 + -1 <= (long)iVar10) break;
      iVar15 = iVar9 + -1;
      lVar11 = lVar12 + -2;
      iVar14 = iVar9;
      lVar12 = lVar12 + -1;
    } while ((char)puVar2[lVar11] < '\0');
    sqlite3Fts5GetVarint(puVar2 + iVar15,&local_38);
    plVar1 = (long *)((long)&pFVar7[1].nn + (long)pFVar4);
    *plVar1 = *plVar1 - local_38;
    iVar5 = *(int *)((long)&pFVar7[1].p + (long)((long)&pFVar4->pData + 4)) + -1;
    *(int *)((long)&pFVar7[1].p + (long)((long)&pFVar4->pData + 4)) = iVar5;
    iVar10 = 0;
    if ((int)uVar6 <= iVar14 + -2) {
      if (puVar2[(long)iVar14 + -2] == '\0') {
        iVar10 = ~uVar6 + iVar14;
        iVar9 = 0;
        lVar12 = (long)iVar14 + -1;
        do {
          lVar11 = lVar12;
          if ((iVar14 - uVar6) + -2 == iVar9) goto LAB_001baaf4;
          iVar9 = iVar9 + 1;
          lVar12 = lVar11 + -1;
        } while (puVar2[lVar11 + -2] == '\0');
        bVar3 = lVar11 + -1 <= (long)(int)uVar6;
        iVar14 = (int)lVar11;
        iVar10 = iVar9;
      }
      else {
        bVar3 = false;
        iVar10 = 0;
      }
      if ((!bVar3) && (lVar12 = (long)(iVar14 + -2), (char)puVar2[lVar12] < '\0')) {
        iVar9 = -1;
        if (((int)uVar6 <= iVar14 + -10) && ((char)puVar2[lVar12 + -1] < '\0')) {
          lVar11 = 0;
          do {
            lVar13 = lVar11;
            if (lVar13 == -7) break;
            lVar11 = lVar13 + -1;
          } while ((char)puVar2[lVar13 + lVar12 + -2] < '\0');
          iVar9 = -(uint)(1U - lVar13 < 8);
        }
        iVar10 = iVar9 + iVar10;
      }
    }
LAB_001baaf4:
    uVar6 = iVar5 - iVar10;
    *(uint *)((long)&pFVar7[1].p + (long)((long)&pFVar4->pData + 4)) = uVar6;
    *(int *)((long)&pFVar7->nn + (long)pFVar4) = iVar15 - iVar10;
    pFVar8 = (Fts5Data *)(ulong)uVar6;
  }
  else {
    *(undefined4 *)((long)&pFVar7->szLeaf + (long)pFVar4) = 1;
    pFVar8 = pFVar7;
  }
  if ((*(int *)((long)&pFVar7->szLeaf + (long)pFVar4) != 0) && (iLvl + 1 < pIter->nLvl)) {
    uVar6 = fts5DlidxIterPrevR(p,pIter,iLvl + 1);
    pFVar8 = (Fts5Data *)(ulong)uVar6;
    if (*(int *)((long)&pFVar7[2].szLeaf + (long)pFVar4) == 0) {
      sqlite3_free(pLvl->pData);
      *(undefined8 *)((long)&pFVar7[1].p + (long)pFVar4) = 0;
      *(undefined8 *)((long)&pFVar7[1].nn + (long)pFVar4) = 0;
      pLvl->pData = (Fts5Data *)0x0;
      *(undefined8 *)((long)&pFVar7->nn + (long)pFVar4) = 0;
      pFVar8 = fts5DataRead(p,(long)*(int *)((long)&pFVar7[3].p + (long)((long)&pFVar4->pData + 4))
                              + (long)iLvl * 0x80000000 + ((ulong)(uint)pIter->iSegid << 0x25) +
                              0x1000000000);
      pLvl->pData = pFVar8;
      if (pFVar8 != (Fts5Data *)0x0) {
        do {
          uVar6 = fts5DlidxLvlNext(pLvl);
          pFVar8 = (Fts5Data *)(ulong)uVar6;
        } while (uVar6 == 0);
        *(undefined4 *)((long)&pFVar7->szLeaf + (long)pFVar4) = 0;
      }
    }
  }
  return (int)pFVar8;
}

Assistant:

static int fts5DlidxIterPrevR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlPrev(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterPrevR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p, 
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ){
          while( fts5DlidxLvlNext(pLvl)==0 );
          pLvl->bEof = 0;
        }
      }
    }
  }

  return pIter->aLvl[0].bEof;
}